

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdiagonal.c
# Opt level: O3

int sdominate(int n,NCformat *Astore)

{
  ulong uVar1;
  long lVar2;
  float fVar3;
  void *addr;
  int_t *addr_00;
  int_t *piVar4;
  float *pfVar5;
  int_t *piVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  int_t iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  float fVar17;
  
  if (n < 1) {
    iVar15 = 0;
  }
  else {
    addr = Astore->nzval;
    addr_00 = Astore->rowind;
    piVar4 = Astore->colptr;
    iVar15 = piVar4[n];
    uVar9 = (ulong)(uint)n;
    uVar8 = 0;
    iVar7 = 0;
    iVar10 = *piVar4;
    do {
      iVar12 = piVar4[uVar8 + 1];
      uVar11 = 1;
      if (iVar10 < iVar12) {
        uVar11 = 0xffffffff;
        lVar14 = 0;
        do {
          if (uVar8 == (uint)addr_00[iVar10 + lVar14]) {
            uVar11 = iVar10 + (int)lVar14;
          }
          lVar14 = lVar14 + 1;
        } while ((long)iVar12 - (long)iVar10 != lVar14);
        uVar11 = uVar11 >> 0x1f;
      }
      iVar7 = iVar7 + uVar11;
      uVar8 = uVar8 + 1;
      iVar10 = iVar12;
    } while (uVar8 != uVar9);
    if (iVar7 == 0) {
      if (0 < n) {
        uVar8 = 0;
        iVar10 = *piVar4;
        do {
          iVar15 = piVar4[uVar8 + 1];
          lVar14 = -1;
          fVar17 = 3e-06;
          if (iVar10 < iVar15) {
            lVar14 = (long)iVar10;
            iVar7 = -1;
            lVar16 = 0;
            fVar17 = 1e-06;
            do {
              if (uVar8 == (uint)addr_00[lVar14 + lVar16]) {
                iVar7 = iVar10 + (int)lVar16;
              }
              fVar17 = fVar17 + ABS(*(float *)((long)addr + lVar16 * 4 + lVar14 * 4));
              lVar16 = lVar16 + 1;
            } while (iVar15 - lVar14 != lVar16);
            fVar17 = fVar17 * 3.0;
            lVar14 = (long)iVar7;
          }
          uVar8 = uVar8 + 1;
          *(float *)((long)addr + lVar14 * 4) = fVar17;
          iVar10 = iVar15;
        } while (uVar8 != uVar9);
      }
      iVar15 = 0;
    }
    else {
      pfVar5 = floatMalloc((long)iVar7 + (long)iVar15);
      piVar6 = intMalloc((int_t)((long)iVar7 + (long)iVar15));
      if (n < 1) {
        iVar15 = 0;
      }
      else {
        iVar10 = *piVar4;
        iVar15 = 0;
        uVar8 = 0;
        do {
          iVar12 = iVar10 - iVar15;
          uVar1 = uVar8 + 1;
          iVar7 = piVar4[uVar8 + 1];
          fVar17 = 3e-06;
          if (iVar12 < iVar7) {
            lVar14 = (long)iVar10;
            iVar13 = -1;
            lVar16 = 0;
            fVar17 = 1e-06;
            do {
              uVar11 = addr_00[(lVar14 + lVar16) - (long)iVar15];
              piVar6[lVar14 + lVar16] = uVar11;
              if (uVar8 == uVar11) {
                iVar13 = iVar12 + (int)lVar16;
              }
              fVar3 = *(float *)((long)addr + lVar16 * 4 + lVar14 * 4 + (long)iVar15 * -4);
              pfVar5[lVar14 + lVar16] = fVar3;
              fVar17 = fVar17 + ABS(fVar3);
              iVar7 = piVar4[uVar1];
              lVar2 = iVar12 + lVar16;
              lVar16 = lVar16 + 1;
            } while (lVar2 + 1 < (long)iVar7);
            fVar17 = fVar17 * 3.0;
            if (iVar13 < 0) goto LAB_0010d3ef;
            pfVar5[iVar13 + iVar15] = fVar17;
          }
          else {
LAB_0010d3ef:
            piVar6[iVar7 + iVar15] = (int_t)uVar8;
            iVar7 = piVar4[uVar1];
            pfVar5[iVar7 + iVar15] = fVar17;
            iVar15 = iVar15 + 1;
          }
          iVar10 = iVar7 + iVar15;
          piVar4[uVar1] = iVar10;
          uVar8 = uVar1;
        } while (uVar1 != uVar9);
      }
      Astore->nzval = pfVar5;
      Astore->rowind = piVar6;
      superlu_free(addr);
      superlu_free(addr_00);
    }
  }
  Astore->nnz = Astore->nnz + iVar15;
  return iVar15;
}

Assistant:

int sdominate(int n, NCformat *Astore)
/* make the matrix diagonally dominant */
{
    float *nzval = (float *)Astore->nzval;
    int_t *rowind = Astore->rowind;
    int_t *colptr = Astore->colptr;
    int_t nnz = colptr[n];
    int fill = 0;
    float *nzval_new;
    int_t *rowind_new;
    int_t i, j, diag;
    double s;

    for (i = 0; i < n; i++)
    {
	diag = -1;
	for (j = colptr[i]; j < colptr[i + 1]; j++)
	    if (rowind[j] == i) diag = j;
	if (diag < 0) fill++;
    }
    if (fill)
    {
	nzval_new = floatMalloc(nnz + fill);
	rowind_new = intMalloc(nnz+ fill);
	fill = 0;
	for (i = 0; i < n; i++)
	{
	    s = 1e-6;
	    diag = -1;
	    for (j = colptr[i] - fill; j < colptr[i + 1]; j++)
	    {
		if ((rowind_new[j + fill] = rowind[j]) == i) diag = j;
		s += fabs(nzval_new[j + fill] = nzval[j]);
	    }
	    if (diag >= 0) {
		nzval_new[diag+fill] = s * 3.0;
	    } else {
		rowind_new[colptr[i + 1] + fill] = i;
		nzval_new[colptr[i + 1] + fill] = s * 3.0;
		fill++;
	    }
	    colptr[i + 1] += fill;
	}
	Astore->nzval = nzval_new;
	Astore->rowind = rowind_new;
	SUPERLU_FREE(nzval);
	SUPERLU_FREE(rowind);
    }
    else
    {
	for (i = 0; i < n; i++)
	{
	    s = 1e-6;
	    diag = -1;
	    for (j = colptr[i]; j < colptr[i + 1]; j++)
	    {
		if (rowind[j] == i) diag = j;
		s += fabs(nzval[j]);
	    }
	    nzval[diag] = s * 3.0;
	}
    }
    Astore->nnz += fill;
    return fill;
}